

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NtkEliminate1One(Abc_Ntk_t *pNtk,int ElimValue,int nMaxSize,int fReverse,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *pPermFanin_00;
  int *pPermFanout_00;
  Vec_Ptr_t *vFanins_00;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *local_80;
  Abc_Obj_t *pNodeNew;
  int local_68;
  int k;
  int i;
  int RetValue;
  int *pPermFanout;
  int *pPermFanin;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vFanins;
  Vec_Ptr_t *vFanouts;
  int fVerbose_local;
  int fReverse_local;
  int nMaxSize_local;
  int ElimValue_local;
  Abc_Ntk_t *pNtk_local;
  
  if (nMaxSize < 1) {
    __assert_fail("nMaxSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x260,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x261,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar1 = Abc_NtkToAig(pNtk);
  if (iVar1 == 0) {
    fprintf(_stdout,"Converting to AIG has failed.\n");
    pNtk_local._4_4_ = 0;
  }
  else {
    if (fReverse == 0) {
      local_80 = Abc_NtkDfs(pNtk,0);
    }
    else {
      local_80 = Abc_NtkDfsReverse(pNtk);
    }
    pPermFanin_00 = (int *)malloc((long)(nMaxSize + 1000) << 2);
    pPermFanout_00 = (int *)malloc((long)(nMaxSize + 1000) << 2);
    vFanins_00 = Vec_PtrAlloc(1000);
    vNodes_00 = Vec_PtrAlloc(1000);
    for (local_68 = 0; iVar1 = Vec_PtrSize(local_80), local_68 < iVar1; local_68 = local_68 + 1) {
      pObj = (Abc_Obj_t *)Vec_PtrEntry(local_80,local_68);
      iVar1 = Abc_ObjIsNode(pObj);
      if ((((iVar1 != 0) && (pAVar6 = Abc_NodeFindCoFanout(pObj), pAVar6 == (Abc_Obj_t *)0x0)) &&
          (iVar1 = Abc_ObjFaninNum(pObj), iVar1 <= nMaxSize)) &&
         ((iVar1 = Abc_NodeIsExor(pObj), iVar1 == 0 &&
          (iVar1 = Abc_NodeCountAppearancesAll(pObj), iVar1 <= ElimValue + 2)))) {
        for (pNodeNew._4_4_ = 0; iVar1 = Abc_ObjFanoutNum(pObj), pNodeNew._4_4_ < iVar1;
            pNodeNew._4_4_ = pNodeNew._4_4_ + 1) {
          pAVar6 = Abc_ObjFanout(pObj,pNodeNew._4_4_);
          iVar1 = Abc_NodeCollapseSuppSize(pObj,pAVar6,vFanins_00);
          if (nMaxSize < iVar1) break;
        }
        iVar1 = Abc_ObjFanoutNum(pObj);
        if (iVar1 <= pNodeNew._4_4_) {
          Abc_NodeCollectFanouts(pObj,vNodes_00);
          for (pNodeNew._4_4_ = 0; iVar1 = Vec_PtrSize(vNodes_00), pNodeNew._4_4_ < iVar1;
              pNodeNew._4_4_ = pNodeNew._4_4_ + 1) {
            pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,pNodeNew._4_4_);
            if (fVerbose != 0) {
              uVar2 = Abc_ObjId(pObj);
              uVar3 = Abc_ObjFaninNum(pObj);
              uVar4 = Abc_ObjId(pAVar6);
              uVar5 = Abc_ObjFaninNum(pAVar6);
              printf("Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",(ulong)uVar2,
                     (ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
            }
            iVar1 = Abc_NodeCollapse1(pObj,pAVar6,vFanins_00,pPermFanin_00,pPermFanout_00);
            if (iVar1 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                            ,0x28c,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)");
            }
            if (fVerbose != 0) {
              iVar1 = Abc_NtkObjNumMax(pNtk);
              pAVar6 = Abc_NtkObj(pNtk,iVar1 + -1);
              if (pAVar6 != (Abc_Obj_t *)0x0) {
                uVar2 = Abc_ObjId(pAVar6);
                uVar3 = Abc_ObjFaninNum(pAVar6);
                printf("resulting in node %5d (supp =%2d).\n",(ulong)uVar2,(ulong)uVar3);
              }
            }
          }
        }
      }
    }
    Vec_PtrFree(vFanins_00);
    Vec_PtrFree(vNodes_00);
    Vec_PtrFree(local_80);
    if (pPermFanin_00 != (int *)0x0) {
      free(pPermFanin_00);
    }
    if (pPermFanout_00 != (int *)0x0) {
      free(pPermFanout_00);
    }
    pNtk_local._4_4_ = 1;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkEliminate1One( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int fReverse, int fVerbose )
{
    Vec_Ptr_t * vFanouts, * vFanins, * vNodes;
    Abc_Obj_t * pNode, * pFanout;
    int * pPermFanin, * pPermFanout;
    int RetValue, i, k;
    assert( nMaxSize > 0 );
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to AIG has failed.\n" );
        return 0;
    }
    // get the nodes in the given order
    vNodes = fReverse? Abc_NtkDfsReverse( pNtk ) : Abc_NtkDfs( pNtk, 0 );
    // go through the nodes and decide is they can be eliminated
    pPermFanin = ABC_ALLOC( int, nMaxSize + 1000 );
    pPermFanout = ABC_ALLOC( int, nMaxSize + 1000 );
    vFanins = Vec_PtrAlloc( 1000 );
    vFanouts = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( !Abc_ObjIsNode(pNode) ) // skip deleted nodes
            continue;
        if ( Abc_NodeFindCoFanout(pNode) != NULL )
            continue;
        if ( Abc_ObjFaninNum(pNode) > nMaxSize )
            continue;
        if ( Abc_NodeIsExor(pNode) )
            continue;
        // skip nodes with more than one fanout
//        if ( Abc_ObjFanoutNum(pNode) != 1 ) 
//            continue;
        // skip nodes that appear in the FF of their fanout more than once
        if ( Abc_NodeCountAppearancesAll( pNode ) > ElimValue + 2 ) 
            continue;       
        Abc_ObjForEachFanout( pNode, pFanout, k )
            if ( Abc_NodeCollapseSuppSize(pNode, pFanout, vFanins) > nMaxSize )
                break;
        if ( k < Abc_ObjFanoutNum(pNode) )
            continue;
        // perform elimination
        Abc_NodeCollectFanouts( pNode, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
        {
            if ( fVerbose )
                printf( "Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                    Abc_ObjId(pNode), Abc_ObjFaninNum(pNode), Abc_ObjId(pFanout), Abc_ObjFaninNum(pFanout) ); 
            RetValue = Abc_NodeCollapse1( pNode, pFanout, vFanins, pPermFanin, pPermFanout );
            assert( RetValue );
            if ( fVerbose )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk) - 1 );
                if ( pNodeNew )
                    printf( "resulting in node %5d (supp =%2d).\n", Abc_ObjId(pNodeNew), Abc_ObjFaninNum(pNodeNew) );
            }
        }
    }
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    ABC_FREE( pPermFanin );
    ABC_FREE( pPermFanout );
    return 1;
}